

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall GslSpan_FixedSizeConversions_Test::TestBody(GslSpan_FixedSizeConversions_Test *this)

{
  bool bVar1;
  char *pcVar2;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_d8;
  span<int,1l> local_c8 [8];
  span<int,_1L> s1_1;
  span<int,_1L> s1;
  span<int,_2L> s2;
  Message local_a8;
  index_type local_a0;
  index_type local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  span<int,__1L> s;
  Message local_68 [3];
  int local_4c;
  index_type local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  span<int,_4L> s4;
  int arr [4];
  GslSpan_FixedSizeConversions_Test *this_local;
  
  s4.storage_.data_ = (storage_type<pstore::gsl::details::extent_type<4L>_>)(pointer)0x200000001;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,4ul>((int (*) [4])&s4);
  local_48 = pstore::gsl::span<int,_4L>::length((span<int,_4L> *)&gtest_ar.message_);
  local_4c = 4;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_40,"s4.length ()","4",&local_48,&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x529,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s.storage_.data_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s.storage_.data_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  pstore::gsl::span<int,-1l>::span<int,4l>
            ((span<int,_1l> *)&gtest_ar_1.message_,(span<int,_4L> *)&gtest_ar.message_);
  local_98 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar_1.message_);
  local_a0 = pstore::gsl::span<int,_4L>::length((span<int,_4L> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_90,"s.length ()","s4.length ()",&local_98,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x52e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s2,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s2);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  pstore::gsl::span<int,_2L>::span((span<int,_2L> *)&s1,(pointer)&s4,2);
  s1_1 = pstore::gsl::span<int,4l>::first<1l>((span<int,4l> *)&gtest_ar.message_);
  local_d8 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::span<int,_4L>::first((span<int,_4L> *)&gtest_ar.message_,1);
  pstore::gsl::span<int,1l>::span<int,_1l>(local_c8,(span<int,__1L> *)&local_d8);
  return;
}

Assistant:

TEST (GslSpan, FixedSizeConversions) {
    int arr[] = {1, 2, 3, 4};

    // converting to an span from an equal size array is ok
    span<int, 4> s4 = make_span (arr);
    EXPECT_EQ (s4.length (), 4);

    // converting to dynamic_range is always ok
    {
        span<int> s = s4;
        EXPECT_EQ (s.length (), s4.length ());
        static_cast<void> (s);
    }

// initialization or assignment to static span that REDUCES size is NOT ok
#ifdef CONFIRM_COMPILATION_ERRORS
    { span<int, 2> s = arr; }
    {
        span<int, 2> s2 = s4;
        static_cast<void> (s2);
    }
#endif

// even when done dynamically
#if 0
    {
        span<int> s = make_span (arr);
        auto f = [&]() {
            span<int, 2> s2 = s;
            static_cast<void>(s2);
        };
        CHECK_THROW(f(), fail_fast);
    }
#endif
    // but doing so explicitly is ok

    // you can convert statically
    {
        span<int, 2> s2 = {arr, 2};
        static_cast<void> (s2);
    }
    {
        span<int, 1> s1 = s4.first<1> ();
        static_cast<void> (s1);
    }

    // ...or dynamically
    {
        // NB: implicit conversion to span<int,1> from span<int>
        span<int, 1> s1 = s4.first (1);
        static_cast<void> (s1);
    }

// initialization or assignment to static span that requires size INCREASE is not ok.
#if 0
    int arr2[2] = {1, 2};
#endif
#ifdef CONFIRM_COMPILATION_ERRORS
    { span<int, 4> s3 = arr2; }
    {
        span<int, 2> s2 = arr2;
        span<int, 4> s4a = s2;
    }
#endif
#if 0
    {
        auto f = [&]() {
            span<int, 4> s4 = {arr2, 2};
            static_cast<void>(s4);
        };
        CHECK_THROW(f(), fail_fast);
    }
    // this should fail - we are trying to assign a small dynamic span to a fixed_size larger one
    span<int> av = arr2;
    auto f = [&]() {
        span<int, 4> s4 = av;
        static_cast<void>(s4);
    };
    CHECK_THROW(f(), fail_fast);
#endif
}